

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefactor.c
# Opt level: O1

void Abc_NtkManRefStop(Abc_ManRef_t *p)

{
  Vec_Ptr_t *pVVar1;
  Vec_Int_t *__ptr;
  Vec_Str_t *__ptr_00;
  long lVar2;
  
  pVVar1 = p->vFuncs;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    if (0 < pVVar1->nSize) {
      lVar2 = 0;
      do {
        if ((void *)0x2 < pVVar1->pArray[lVar2]) {
          free(pVVar1->pArray[lVar2]);
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < pVVar1->nSize);
    }
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (void **)0x0;
    }
    free(pVVar1);
  }
  pVVar1 = p->vVars;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  __ptr = p->vMemory;
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    free(__ptr);
  }
  pVVar1 = p->vVisited;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  __ptr_00 = p->vCube;
  if (__ptr_00->pArray != (char *)0x0) {
    free(__ptr_00->pArray);
    __ptr_00->pArray = (char *)0x0;
  }
  if (__ptr_00 != (Vec_Str_t *)0x0) {
    free(__ptr_00);
  }
  if (p != (Abc_ManRef_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Abc_NtkManRefStop( Abc_ManRef_t * p )
{
    Vec_PtrFreeFree( p->vFuncs );
    Vec_PtrFree( p->vVars );
    Vec_IntFree( p->vMemory );
    Vec_PtrFree( p->vVisited );
    Vec_StrFree( p->vCube );
    ABC_FREE( p );
}